

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::AttemptToEvictConnection(CConnman *this)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  ConstevalFormatString<2U> fmt;
  _Storage<long,_true> args_1;
  reference ppCVar2;
  NodeId NVar3;
  long *plVar4;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar5;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1_1;
  CNode *node;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  NodeEvictionCandidate candidate;
  iterator __end1;
  iterator __begin1;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> vEvictionCandidates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  optional<long> node_id_to_evict;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  CNode *in_stack_fffffffffffffe00;
  CNode *in_stack_fffffffffffffe08;
  atomic<bool> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  char *pcVar6;
  CNode *pCVar7;
  pointer *ppNVar8;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *vEvictionCandidates_00;
  bool local_101;
  undefined1 local_88 [4];
  ConnectionType local_84;
  CNode **local_80;
  CNode **local_78;
  Level in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  size_t local_8;
  
  local_8 = *(size_t *)(in_FS_OFFSET + 0x28);
  vEvictionCandidates_00 = in_RDI;
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  fmt.fmt = (char *)MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                              ((AnnotatedMixin<std::recursive_mutex> *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30
             ,(char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             SUB41((uint)in_stack_fffffffffffffe18 >> 0x18,0));
  local_78 = (CNode **)
             std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
                       ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffe00);
  local_80 = (CNode **)
             std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                       ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffe00);
  while (bVar1 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffe08,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffe00), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    pCVar7 = *ppCVar2;
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe10);
    if (!bVar1) {
      CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      std::atomic::operator_cast_to_duration
                ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                 in_stack_fffffffffffffe00);
      std::atomic::operator_cast_to_duration
                ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 in_stack_fffffffffffffe00);
      std::atomic::operator_cast_to_duration
                ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 in_stack_fffffffffffffe00);
      std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe10);
      std::atomic<bool>::load
                (in_stack_fffffffffffffe10,(memory_order)((ulong)in_stack_fffffffffffffe08 >> 0x20))
      ;
      std::atomic<bool>::load
                (in_stack_fffffffffffffe10,(memory_order)((ulong)in_stack_fffffffffffffe08 >> 0x20))
      ;
      CNetAddr::IsLocal((CNetAddr *)in_stack_fffffffffffffe00);
      CNode::ConnectedThroughNetwork(in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe60 = local_88;
      bVar1 = CNode::HasPermission
                        ((CNode *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),None
                        );
      in_stack_fffffffffffffe6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe6c);
      *in_stack_fffffffffffffe60 = bVar1;
      local_84 = pCVar7->m_conn_type;
      std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::push_back
                ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
                 in_stack_fffffffffffffe08,(value_type *)in_stack_fffffffffffffe00);
    }
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  oVar5 = SelectNodeToEvict(vEvictionCandidates_00);
  args_1._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<long> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                    );
  if (bVar1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
               SUB41((uint)in_stack_fffffffffffffe18 >> 0x18,0));
    ppNVar8 = &in_RDI[0xf].
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffe00);
    std::vector<CNode_*,_std::allocator<CNode_*>_>::end
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffe00);
    while (bVar1 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_fffffffffffffe08,
                              (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_fffffffffffffe00), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
                operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      pCVar7 = *ppCVar2;
      NVar3 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      plVar4 = std::optional<long>::operator*
                         ((optional<long> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (NVar3 == *plVar4) {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (char *)in_stack_fffffffffffffe10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (char *)in_stack_fffffffffffffe10);
          pcVar6 = "selected %s connection for eviction peer=%d; disconnecting\n";
          CNode::ConnectionTypeAsString_abi_cxx11_(in_stack_fffffffffffffe00);
          CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe08 = (CNode *)&stack0xffffffffffffffd8;
          in_stack_fffffffffffffdf8 = 1;
          logging_function._M_str._0_4_ = in_stack_fffffffffffffec8;
          logging_function._M_len = (size_t)ppNVar8;
          logging_function._M_str._4_4_ = in_stack_fffffffffffffecc;
          source_file._M_str = (char *)pCVar7;
          source_file._M_len = (size_t)pcVar6;
          LogPrintFormatInternal<std::__cxx11::string,long>
                    (logging_function,source_file,in_stack_fffffffffffffe6c,
                     (LogFlags)in_stack_fffffffffffffe60,in_stack_ffffffffffffffa0,fmt,
                     in_stack_ffffffffffffffb0,(long *)args_1);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   false);
        local_101 = true;
        goto LAB_0100033c;
      }
      __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
      operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    local_101 = false;
LAB_0100033c:
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  else {
    local_101 = false;
  }
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::~vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             in_stack_fffffffffffffe08);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_101;
}

Assistant:

bool CConnman::AttemptToEvictConnection()
{
    std::vector<NodeEvictionCandidate> vEvictionCandidates;
    {

        LOCK(m_nodes_mutex);
        for (const CNode* node : m_nodes) {
            if (node->fDisconnect)
                continue;
            NodeEvictionCandidate candidate{
                .id = node->GetId(),
                .m_connected = node->m_connected,
                .m_min_ping_time = node->m_min_ping_time,
                .m_last_block_time = node->m_last_block_time,
                .m_last_tx_time = node->m_last_tx_time,
                .fRelevantServices = node->m_has_all_wanted_services,
                .m_relay_txs = node->m_relays_txs.load(),
                .fBloomFilter = node->m_bloom_filter_loaded.load(),
                .nKeyedNetGroup = node->nKeyedNetGroup,
                .prefer_evict = node->m_prefer_evict,
                .m_is_local = node->addr.IsLocal(),
                .m_network = node->ConnectedThroughNetwork(),
                .m_noban = node->HasPermission(NetPermissionFlags::NoBan),
                .m_conn_type = node->m_conn_type,
            };
            vEvictionCandidates.push_back(candidate);
        }
    }
    const std::optional<NodeId> node_id_to_evict = SelectNodeToEvict(std::move(vEvictionCandidates));
    if (!node_id_to_evict) {
        return false;
    }
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (pnode->GetId() == *node_id_to_evict) {
            LogDebug(BCLog::NET, "selected %s connection for eviction peer=%d; disconnecting\n", pnode->ConnectionTypeAsString(), pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}